

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O2

int Fax3Encode2DRow(TIFF *tif,uchar *bp,uchar *rp,uint32_t bits)

{
  uint bs;
  uint bs_00;
  int iVar1;
  uint uVar2;
  int32_t iVar3;
  int32_t iVar4;
  tableentry *tab;
  uint32_t uVar5;
  int bs_01;
  ulong uVar6;
  
  bs_00 = 0;
  bs = 0;
  if (-1 < (char)*bp) {
    bs = find0span(bp,0,bits);
  }
  if (-1 < (char)*rp) {
    bs_00 = find0span(rp,0,bits);
  }
  uVar6 = 0;
  do {
    uVar5 = bits;
    if (bs_00 < bits) {
      if ((rp[bs_00 >> 3] >> (~(byte)bs_00 & 7) & 1) == 0) {
        iVar1 = find0span(rp,bs_00,bits);
      }
      else {
        iVar1 = find1span(rp,bs_00,bits);
      }
      uVar5 = iVar1 + bs_00;
    }
    if (uVar5 < bs) {
      iVar1 = Fax3PutBits(tif,1,4);
      bs = uVar5;
LAB_00259a3c:
      uVar2 = bs;
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      uVar2 = bs_00 - bs;
      if ((bs <= bs_00) && (uVar2 < 4)) {
LAB_00259a18:
        iVar1 = Fax3PutBits(tif,(uint)vcodes[uVar2 + 3].code,(uint)vcodes[uVar2 + 3].length);
        goto LAB_00259a3c;
      }
      if ((bs_00 < bs) && (bs - bs_00 < 4)) {
        uVar2 = -(bs - bs_00);
        goto LAB_00259a18;
      }
      uVar2 = bits;
      if (bs < bits) {
        if ((bp[bs >> 3] >> (~(byte)bs & 7) & 1) == 0) {
          iVar1 = find0span(bp,bs,bits);
        }
        else {
          iVar1 = find1span(bp,bs,bits);
        }
        uVar2 = iVar1 + bs;
      }
      iVar1 = Fax3PutBits(tif,1,3);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = (int)uVar6;
      if ((iVar1 + bs == 0) || ((bp[uVar6 >> 3] >> (~(byte)uVar6 & 7) & 1) == 0)) {
        iVar1 = putspan(tif,bs - iVar1,TIFFFaxWhiteCodes);
        if (iVar1 == 0) {
          return 0;
        }
        tab = TIFFFaxBlackCodes;
      }
      else {
        iVar1 = putspan(tif,bs - iVar1,TIFFFaxBlackCodes);
        if (iVar1 == 0) {
          return 0;
        }
        tab = TIFFFaxWhiteCodes;
      }
      iVar1 = putspan(tif,uVar2 - bs,tab);
      if (iVar1 == 0) {
        return 0;
      }
    }
    if (bits <= uVar2) {
      return 1;
    }
    if ((bp[uVar2 >> 3] >> (~(byte)uVar2 & 7) & 1) == 0) {
      iVar3 = find0span(bp,uVar2,bits);
      iVar4 = find1span(rp,uVar2,bits);
      bs_01 = iVar4 + uVar2;
      iVar1 = find0span(rp,bs_01,bits);
    }
    else {
      iVar3 = find1span(bp,uVar2,bits);
      iVar4 = find0span(rp,uVar2,bits);
      bs_01 = iVar4 + uVar2;
      iVar1 = find1span(rp,bs_01,bits);
    }
    bs_00 = bs_01 + iVar1;
    bs = iVar3 + uVar2;
    uVar6 = (ulong)uVar2;
  } while( true );
}

Assistant:

static int Fax3Encode2DRow(TIFF *tif, unsigned char *bp, unsigned char *rp,
                           uint32_t bits)
{
#define PIXEL(buf, ix) ((((buf)[(ix) >> 3]) >> (7 - ((ix)&7))) & 1)
    uint32_t a0 = 0;
    uint32_t a1 = (PIXEL(bp, 0) != 0 ? 0 : finddiff(bp, 0, bits, 0));
    uint32_t b1 = (PIXEL(rp, 0) != 0 ? 0 : finddiff(rp, 0, bits, 0));
    uint32_t a2, b2;

    for (;;)
    {
        b2 = finddiff2(rp, b1, bits, PIXEL(rp, b1));
        if (b2 >= a1)
        {
            /* Naive computation triggers
             * -fsanitize=undefined,unsigned-integer-overflow */
            /* although it is correct unless the difference between both is < 31
             * bit */
            /* int32_t d = b1 - a1; */
            int32_t d = (b1 >= a1 && b1 - a1 <= 3U)  ? (int32_t)(b1 - a1)
                        : (b1 < a1 && a1 - b1 <= 3U) ? -(int32_t)(a1 - b1)
                                                     : 0x7FFFFFFF;
            if (!(-3 <= d && d <= 3))
            { /* horizontal mode */
                a2 = finddiff2(bp, a1, bits, PIXEL(bp, a1));
                if (!putcode(tif, &horizcode))
                    return 0;
                if (a0 + a1 == 0 || PIXEL(bp, a0) == 0)
                {
                    if (!putspan(tif, a1 - a0, TIFFFaxWhiteCodes))
                        return 0;
                    if (!putspan(tif, a2 - a1, TIFFFaxBlackCodes))
                        return 0;
                }
                else
                {
                    if (!putspan(tif, a1 - a0, TIFFFaxBlackCodes))
                        return 0;
                    if (!putspan(tif, a2 - a1, TIFFFaxWhiteCodes))
                        return 0;
                }
                a0 = a2;
            }
            else
            { /* vertical mode */
                if (!putcode(tif, &vcodes[d + 3]))
                    return 0;
                a0 = a1;
            }
        }
        else
        { /* pass mode */
            if (!putcode(tif, &passcode))
                return 0;
            a0 = b2;
        }
        if (a0 >= bits)
            break;
        a1 = finddiff(bp, a0, bits, PIXEL(bp, a0));
        b1 = finddiff(rp, a0, bits, !PIXEL(bp, a0));
        b1 = finddiff(rp, b1, bits, PIXEL(bp, a0));
    }
    return (1);
#undef PIXEL
}